

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

string * __thiscall
kratos::LiftGenVarInstanceVisitor::find_common_instance_name_abi_cxx11_
          (string *__return_storage_ptr__,LiftGenVarInstanceVisitor *this,
          vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
          *generators)

{
  char cVar1;
  value_type *pvVar2;
  const_reference ppMVar3;
  Generator *pGVar4;
  ulong uVar5;
  value_type *pvVar6;
  char *pcVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8 [35];
  undefined1 local_1d5;
  char *local_1c8;
  value_type *c;
  uint64_t i;
  ulong uStack_1b0;
  bool diff;
  uint64_t s;
  string *inst_ref;
  stringstream gen_inst_name;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *generators_local;
  __string_type *str;
  
  gen_inst_name._384_8_ = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&inst_ref);
  ppMVar3 = std::
            vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
            ::operator[]((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                          *)gen_inst_name._384_8_,0);
  pGVar4 = ModuleInstantiationStmt::target(*ppMVar3);
  s = (uint64_t)&pGVar4->instance_name;
  for (uStack_1b0 = 0; uVar8 = uStack_1b0, uVar5 = std::__cxx11::string::size(), uVar8 < uVar5;
      uStack_1b0 = uStack_1b0 + 1) {
    i._7_1_ = 0;
    for (c = (value_type *)0x1; pvVar2 = c,
        pvVar6 = (value_type *)
                 std::
                 vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                 ::size((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                         *)gen_inst_name._384_8_), pvVar2 < pvVar6; c = c + 1) {
      ppMVar3 = std::
                vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                ::operator[]((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                              *)gen_inst_name._384_8_,(size_type)c);
      pGVar4 = ModuleInstantiationStmt::target(*ppMVar3);
      local_1c8 = (char *)std::__cxx11::string::operator[]((ulong)&pGVar4->instance_name);
      cVar1 = *local_1c8;
      pcVar7 = (char *)std::__cxx11::string::operator[](s);
      if (cVar1 != *pcVar7) {
        i._7_1_ = 1;
        break;
      }
    }
    if ((i._7_1_ & 1) != 0) break;
    pcVar7 = (char *)std::__cxx11::string::operator[](s);
    std::operator<<((ostream *)&gen_inst_name.field_0x8,*pcVar7);
  }
  local_1d5 = 0;
  std::__cxx11::stringstream::str();
  while( true ) {
    std::__cxx11::string::size();
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar7 != '_') break;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_1f8,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1f8);
    std::__cxx11::string::~string(local_1f8);
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    ppMVar3 = std::
              vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
              ::operator[]((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                            *)gen_inst_name._384_8_,0);
    pGVar4 = ModuleInstantiationStmt::target(*ppMVar3);
    std::operator+(&local_218,"genblk_",&pGVar4->name);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  local_1d5 = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&inst_ref);
  return __return_storage_ptr__;
}

Assistant:

static std::string find_common_instance_name(
        const std::vector<ModuleInstantiationStmt*>& generators) {
        std::stringstream gen_inst_name;
        auto const& inst_ref = generators[0]->target()->instance_name;
        for (uint64_t s = 0; s < inst_ref.size(); s++) {
            bool diff = false;
            for (uint64_t i = 1; i < generators.size(); i++) {
                auto const& c = generators[i]->target()->instance_name[s];
                if (c != inst_ref[s]) {
                    diff = true;
                    break;
                }
            }
            if (diff) {
                break;
            } else {
                gen_inst_name << inst_ref[s];
            }
        }
        auto str = gen_inst_name.str();
        // remote _ at the end
        while (str[str.size() - 1] == '_') {
            str = str.substr(0, str.size() - 1);
        }
        // if it's empty, use gen_blk and the definition name
        if (str.empty()) {
            str = "genblk_" + generators[0]->target()->name;
        }
        return str;
    }